

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

void emit_GLSL_DEFB(Context *ctx)

{
  uint uVar1;
  char *pcVar2;
  size_t in_RDX;
  char varname [64];
  char acStack_58 [72];
  
  get_GLSL_destarg_varname(ctx,acStack_58,in_RDX);
  push_output(ctx,&ctx->globals);
  pcVar2 = "true";
  if (ctx->dwords[0] == 0) {
    pcVar2 = "false";
  }
  output_line(ctx,"const bool %s = %s;",acStack_58,pcVar2);
  if (0 < ctx->output_stack_len) {
    uVar1 = ctx->output_stack_len - 1;
    ctx->output_stack_len = uVar1;
    ctx->output = ctx->output_stack[uVar1];
    ctx->indent = ctx->indent_stack[uVar1];
    return;
  }
  __assert_fail("ctx->output_stack_len > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                ,0x173,"void pop_output(Context *)");
}

Assistant:

static void emit_GLSL_DEFB(Context *ctx)
{
    char varname[64]; get_GLSL_destarg_varname(ctx, varname, sizeof (varname));
    push_output(ctx, &ctx->globals);
    output_line(ctx, "const bool %s = %s;",
                varname, ctx->dwords[0] ? "true" : "false");
    pop_output(ctx);
}